

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O0

int init_thread_sync_data(thread_data *td,char *hostname,int port,addrinfo *hints)

{
  thread_sync_data *tsd_00;
  pthread_mutex_t *ppVar1;
  char *pcVar2;
  thread_sync_data *tsd;
  addrinfo *hints_local;
  int port_local;
  char *hostname_local;
  thread_data *td_local;
  
  tsd_00 = &td->tsd;
  memset(tsd_00,0,0x60);
  (td->tsd).td = td;
  (td->tsd).port = port;
  (td->tsd).done = 1;
  memcpy(&(td->tsd).hints,hints,0x30);
  ppVar1 = (pthread_mutex_t *)(*Curl_cmalloc)(0x28);
  tsd_00->mtx = ppVar1;
  if (tsd_00->mtx != (pthread_mutex_t *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)tsd_00->mtx,(pthread_mutexattr_t *)0x0);
    (td->tsd).sock_error = 0;
    pcVar2 = (*Curl_cstrdup)(hostname);
    (td->tsd).hostname = pcVar2;
    if ((td->tsd).hostname != (char *)0x0) {
      return 1;
    }
  }
  destroy_thread_sync_data(tsd_00);
  return 0;
}

Assistant:

static
int init_thread_sync_data(struct thread_data * td,
                           const char *hostname,
                           int port,
                           const struct addrinfo *hints)
{
  struct thread_sync_data *tsd = &td->tsd;

  memset(tsd, 0, sizeof(*tsd));

  tsd->td = td;
  tsd->port = port;
  /* Treat the request as done until the thread actually starts so any early
   * cleanup gets done properly.
   */
  tsd->done = 1;
#ifdef HAVE_GETADDRINFO
  DEBUGASSERT(hints);
  tsd->hints = *hints;
#else
  (void) hints;
#endif

  tsd->mtx = malloc(sizeof(curl_mutex_t));
  if(tsd->mtx == NULL)
    goto err_exit;

  Curl_mutex_init(tsd->mtx);

  tsd->sock_error = CURL_ASYNC_SUCCESS;

  /* Copying hostname string because original can be destroyed by parent
   * thread during gethostbyname execution.
   */
  tsd->hostname = strdup(hostname);
  if(!tsd->hostname)
    goto err_exit;

  return 1;

 err_exit:
  /* Memory allocation failed */
  destroy_thread_sync_data(tsd);
  return 0;
}